

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpinLock.cpp
# Opt level: O0

void __thiscall Threading::SpinLock::Wait(SpinLock *this)

{
  bool bVar1;
  ulong local_20;
  size_t Attempt;
  size_t NumAttemptsToYield;
  SpinLock *this_local;
  
  local_20 = 0;
  while( true ) {
    if (0x3f < local_20) {
      std::this_thread::yield();
      return;
    }
    bVar1 = is_locked(this);
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void SpinLock::Wait() noexcept
{
    // Wait for the lock to be released without generating cache misses.
    constexpr size_t NumAttemptsToYield = 64;
    for (size_t Attempt = 0; Attempt < NumAttemptsToYield; ++Attempt)
    {
        if (!is_locked())
            return;

        // Issue X86 PAUSE or ARM YIELD instruction to reduce contention
        // between hyper-threads.
        PAUSE();
    }

    std::this_thread::yield();
}